

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O3

void __thiscall duckdb_tdigest::TDigest::updateCumulative(TDigest *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pCVar1;
  pointer pCVar2;
  pointer pdVar3;
  iterator iVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double previous;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  pCVar1 = (this->processed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->processed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pCVar2 - (long)pCVar1 >> 4;
  this_00 = &this->cumulative_;
  pdVar3 = (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar3;
  }
  std::vector<double,_std::allocator<double>_>::reserve(this_00,lVar5 + 1);
  local_48 = 0.0;
  if (pCVar2 != pCVar1) {
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    lVar6 = 8;
    do {
      dVar7 = *(double *)
               ((long)&((this->processed_).
                        super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                        ._M_impl.super__Vector_impl_data._M_start)->mean_ + lVar6);
      local_30 = dVar7 * 0.5 + local_48;
      iVar4._M_current =
           (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_40 = local_48;
        local_38 = dVar7;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (this_00,iVar4,&local_30);
        dVar7 = local_38;
        local_48 = local_40;
      }
      else {
        *iVar4._M_current = local_30;
        (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      local_48 = dVar7 + local_48;
      lVar6 = lVar6 + 0x10;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  iVar4._M_current =
       (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar4,&local_48);
  }
  else {
    *iVar4._M_current = local_48;
    (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  return;
}

Assistant:

void updateCumulative() {
		const auto n = processed_.size();
		cumulative_.clear();
		cumulative_.reserve(n + 1);
		auto previous = 0.0;
		for (Index i = 0; i < n; i++) {
			auto current = weight(i);
			auto halfCurrent = current / 2.0;
			cumulative_.push_back(previous + halfCurrent);
			previous = previous + current;
		}
		cumulative_.push_back(previous);
	}